

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O0

fio_str_info_s *
fiobj_data_read_file(fio_str_info_s *__return_storage_ptr__,FIOBJ io,intptr_t length)

{
  int64_t iVar1;
  int *piVar2;
  size_t sVar3;
  fio_str_info_s *data;
  ssize_t l;
  uintptr_t fsize;
  intptr_t length_local;
  FIOBJ io_local;
  
  iVar1 = fiobj_data_get_fd_size(io);
  fsize = length;
  if (length < 1) {
    fsize = (iVar1 - *(long *)(io + 0x10)) + length;
  }
  if ((long)fsize < 1) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    memset(__return_storage_ptr__,0,0x18);
  }
  else if (*(ulong *)(io + 0x20) < fsize + *(long *)(io + 0x28)) {
    *(undefined8 *)(io + 0x20) = 0;
    *(undefined8 *)(io + 0x28) = 0;
    fiobj_data_pre_write(io,fsize);
    do {
      sVar3 = pread(*(int *)(io + 0x30),*(void **)(io + 8),fsize,*(__off_t *)(io + 0x10));
      if (sVar3 != 0xffffffffffffffff) break;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
    if ((sVar3 == 0xffffffffffffffff) || (sVar3 == 0)) {
      memset(__return_storage_ptr__,0,0x18);
    }
    else {
      *(size_t *)(io + 0x10) = sVar3 + *(long *)(io + 0x10);
      __return_storage_ptr__->capa = 0;
      __return_storage_ptr__->len = sVar3;
      __return_storage_ptr__->data = *(char **)(io + 8);
    }
  }
  else {
    __return_storage_ptr__->capa = 0;
    __return_storage_ptr__->len = fsize;
    __return_storage_ptr__->data = (char *)(*(long *)(io + 8) + *(long *)(io + 0x28));
    *(uintptr_t *)(io + 0x28) = fsize + *(long *)(io + 0x28);
    *(uintptr_t *)(io + 0x10) = fsize + *(long *)(io + 0x10);
  }
  return __return_storage_ptr__;
}

Assistant:

static fio_str_info_s fiobj_data_read_file(FIOBJ io, intptr_t length) {
  uintptr_t fsize = fiobj_data_get_fd_size(io);

  if (length <= 0) {
    /* read to EOF - length */
    length = (fsize - obj2io(io)->source.fpos) + length;
  }

  if (length <= 0) {
    /* We are at EOF - length or beyond */
    errno = 0;
    return (fio_str_info_s){.data = NULL, .len = 0};
  }

  /* reading length bytes */
  if (length + obj2io(io)->pos <= obj2io(io)->len) {
    /* the data already exists in the buffer */
    // fprintf(stderr, "in_buffer...\n");
    fio_str_info_s data = {.data =
                               (char *)(obj2io(io)->buffer + obj2io(io)->pos),
                           .len = (uintptr_t)length};
    obj2io(io)->pos += length;
    obj2io(io)->source.fpos += length;
    return data;
  } else {
    /* read the data into the buffer - internal counting gets invalidated */
    // fprintf(stderr, "populate buffer...\n");
    obj2io(io)->len = 0;
    obj2io(io)->pos = 0;
    fiobj_data_pre_write(io, length);
    ssize_t l;
  retry_int:
    l = pread(obj2io(io)->fd, obj2io(io)->buffer, length,
              obj2io(io)->source.fpos);
    if (l == -1 && errno == EINTR)
      goto retry_int;
    if (l == -1 || l == 0)
      return (fio_str_info_s){.data = NULL, .len = 0};
    obj2io(io)->source.fpos += l;
    return (fio_str_info_s){.data = (char *)obj2io(io)->buffer, .len = l};
  }
}